

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_access.h
# Opt level: O2

int __thiscall
Gudhi::persistence_matrix::
Row_access<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
::unlink(Row_access<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
         *this,char *__name)

{
  size_type sVar1;
  
  if (this->rows_ != (Row_container *)0x0) {
    sVar1 = std::
            _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
            ::erase(&(this->rows_->
                     super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[*(uint *)(__name + 4)]._M_t,
                    (key_type *)__name);
    return (int)sVar1;
  }
  return 0;
}

Assistant:

inline void Row_access<Master_matrix>::unlink(Matrix_entry* entry) 
{
  if (rows_ == nullptr) return;

  if constexpr (Master_matrix::Option_list::has_intrusive_rows) {
    entry->Base_hook_matrix_row::unlink();
  } else {
    if constexpr (Master_matrix::Option_list::has_removable_rows) {
      auto it = rows_->find(entry->get_row_index());
      it->second.erase(*entry);
    } else {
      rows_->operator[](entry->get_row_index()).erase(*entry);
    }
  }
}